

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

string * extractFileName(string *__return_storage_ptr__,string *src)

{
  size_type sVar1;
  char cVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  _Alloc_hider local_30;
  size_type local_28;
  size_type local_20;
  undefined8 uStack_18;
  
  sVar3 = src->_M_string_length;
  if (sVar3 != 0) {
    sVar4 = sVar3;
    sVar5 = sVar3;
    do {
      sVar1 = sVar5 - 1;
      cVar2 = (src->_M_dataplus)._M_p[sVar5 - 1];
      if (cVar2 == '.') {
        if (sVar4 == sVar3) {
          sVar4 = sVar1;
        }
      }
      else if ((cVar2 == '/') || (cVar2 == '\\')) {
        std::__cxx11::string::substr((ulong)&local_30,(ulong)src);
        if ((local_28 != 0) && (local_30._M_p[local_28 - 1] == '\"')) {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
          if ((size_type *)local_30._M_p == &local_20) {
            return __return_storage_ptr__;
          }
          operator_delete(local_30._M_p,local_20 + 1);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((size_type *)local_30._M_p == &local_20) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_18;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
        }
        __return_storage_ptr__->_M_string_length = local_28;
        return __return_storage_ptr__;
      }
      sVar5 = sVar1;
    } while (sVar1 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string extractFileName(const string& src)
{
    size_t endPos = src.size();
    for (size_t i = src.size(); i-- > 0;)
        if (src[i] == '.')
        {
            if (endPos == src.size())
                endPos = i;
        }
        else if (src[i] == '/' || src[i] == '\\')
        {
            string rez = src.substr(i + 1, endPos - i - 1);
            if (!rez.empty() && rez[rez.size() - 1] == '\"')
                return rez.substr(0, rez.size() - 1);
            return rez;
        }
    return "";
}